

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE
CloneDiagnosticPropertyData(IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *source)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE result;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *source_local;
  
  l = (LOGGER_LOG)0x0;
  if (source == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"CloneDiagnosticPropertyData",0xc4,1,"Invalid argument - source is NULL");
    }
  }
  else {
    l = (LOGGER_LOG)malloc(0x10);
    if ((char **)l == (char **)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"CloneDiagnosticPropertyData",0xcb,1,"malloc failed");
      }
    }
    else {
      *(char **)((long)l + 8) = (char *)0x0;
      *(char **)l = (char *)0x0;
      if ((source->diagnosticCreationTimeUtc == (char *)0x0) ||
         (iVar1 = mallocAndStrcpy_s((char **)((long)l + 8),source->diagnosticCreationTimeUtc),
         iVar1 == 0)) {
        if ((source->diagnosticId != (char *)0x0) &&
           (iVar1 = mallocAndStrcpy_s((char **)l,source->diagnosticId), iVar1 != 0)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                      ,"CloneDiagnosticPropertyData",0xd9,1,
                      "mallocAndStrcpy_s for diagnosticId failed");
          }
          free(*(char **)((long)l + 8));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                    ,"CloneDiagnosticPropertyData",0xd3,1,
                    "mallocAndStrcpy_s for diagnosticCreationTimeUtc failed");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)l;
}

Assistant:

static IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE CloneDiagnosticPropertyData(const IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* source)
{
    IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE result = NULL;
    if (source == NULL)
    {
        LogError("Invalid argument - source is NULL");
    }
    else
    {
        result = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)malloc(sizeof(IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA));
        if (result == NULL)
        {
            LogError("malloc failed");
        }
        else
        {
            result->diagnosticCreationTimeUtc = NULL;
            result->diagnosticId = NULL;
            if (source->diagnosticCreationTimeUtc != NULL && mallocAndStrcpy_s(&result->diagnosticCreationTimeUtc, source->diagnosticCreationTimeUtc) != 0)
            {
                LogError("mallocAndStrcpy_s for diagnosticCreationTimeUtc failed");
                free(result);
                result = NULL;
            }
            else if (source->diagnosticId != NULL && mallocAndStrcpy_s(&result->diagnosticId, source->diagnosticId) != 0)
            {
                LogError("mallocAndStrcpy_s for diagnosticId failed");
                free(result->diagnosticCreationTimeUtc);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}